

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsPosixTestProcess.cpp
# Opt level: O0

int __thiscall xs::PosixTestProcess::readTestLog(PosixTestProcess *this,deUint8 *dst,int numBytes)

{
  bool bVar1;
  deBool dVar2;
  deUint64 dVar3;
  char *pcVar4;
  ssize_t sVar5;
  PosixTestProcess *in_RCX;
  int numBytes_local;
  deUint8 *dst_local;
  PosixTestProcess *this_local;
  
  bVar1 = posix::FileReader::isRunning(&this->m_logReader);
  if (!bVar1) {
    dVar3 = deGetMicroseconds();
    if (5000000 < dVar3 - this->m_processStartTime) {
      (*(this->super_TestProcess)._vptr_TestProcess[3])();
      return 0;
    }
    in_RCX = this;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    dVar2 = deFileExists(pcVar4);
    if (dVar2 == 0) {
      return 0;
    }
    pcVar4 = (char *)std::__cxx11::string::c_str();
    posix::FileReader::start(&this->m_logReader,pcVar4);
  }
  sVar5 = posix::FileReader::read
                    (&this->m_logReader,(int)dst,(void *)(ulong)(uint)numBytes,(size_t)in_RCX);
  return (int)sVar5;
}

Assistant:

int PosixTestProcess::readTestLog (deUint8* dst, int numBytes)
{
	if (!m_logReader.isRunning())
	{
		if (deGetMicroseconds() - m_processStartTime > LOG_FILE_TIMEOUT*1000)
		{
			// Timeout, kill process.
			terminate();
			return 0; // \todo [2013-08-13 pyry] Throw exception?
		}

		if (!deFileExists(m_logFileName.c_str()))
			return 0;

		// Start reader.
		m_logReader.start(m_logFileName.c_str());
	}

	DE_ASSERT(m_logReader.isRunning());
	return m_logReader.read(dst, numBytes);
}